

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

SVInt __thiscall
slang::SVInt::fromDouble(SVInt *this,bitwidth_t bits,double value,bool isSigned,bool round)

{
  byte bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  ulong value_00;
  uint uVar3;
  SVInt SVar4;
  SVInt result;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_40;
  uint local_38;
  byte local_33;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_30;
  uint local_28;
  byte local_23;
  undefined8 uVar2;
  
  uVar3 = (uint)((ulong)value >> 0x34) & 0x7ff;
  if (uVar3 == 0x3fe && round) {
    SVInt((SVInt *)&local_40,bits,1,isSigned);
    if ((long)value < 0) {
      SVar4 = operator-(this);
      uVar2 = SVar4.super_SVIntStorage._8_8_;
    }
    else {
      SVInt(this,(SVIntStorage *)&local_40);
      uVar2 = extraout_RDX;
    }
  }
  else {
    if (uVar3 < 0x3ff || uVar3 == 0x7ff) {
      SVInt(this,bits,0,isSigned);
      uVar2 = extraout_RDX_00;
      goto LAB_001906ff;
    }
    value_00 = ((ulong)value & 0xfffffffffffff) + 0x10000000000000;
    if (uVar3 < 0x433) {
      bVar1 = 0x33 - (char)uVar3;
      SVInt((SVInt *)&local_40,bits,
            (ulong)((~(-1L << (bVar1 & 0x3f)) & value_00) >> (0x32U - (char)uVar3 & 0x3f) != 0 &&
                   round) + (value_00 >> (bVar1 & 0x3f)),isSigned);
      if ((long)value < 0) {
        SVar4 = operator-(this);
        uVar2 = SVar4.super_SVIntStorage._8_8_;
      }
      else {
        SVInt(this,(SVIntStorage *)&local_40);
        uVar2 = extraout_RDX_01;
      }
    }
    else {
      SVInt((SVInt *)&local_40,bits,value_00,isSigned);
      shl((SVInt *)&local_30,(bitwidth_t)&local_40);
      operator=((SVInt *)&local_40,(SVInt *)&local_30);
      if (((0x40 < local_28) || ((local_23 & 1) != 0)) && ((void *)local_30.val != (void *)0x0)) {
        operator_delete__(local_30.pVal);
      }
      if ((long)value < 0) {
        SVar4 = operator-(this);
        uVar2 = SVar4.super_SVIntStorage._8_8_;
      }
      else {
        SVInt(this,(SVIntStorage *)&local_40);
        uVar2 = extraout_RDX_02;
      }
    }
  }
  if (((0x40 < local_38) || ((local_33 & 1) != 0)) && ((void *)local_40.val != (void *)0x0)) {
    operator_delete__(local_40.pVal);
    uVar2 = extraout_RDX_03;
  }
LAB_001906ff:
  SVar4.super_SVIntStorage.bitWidth = (int)uVar2;
  SVar4.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar2 >> 0x20);
  SVar4.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar2 >> 0x28);
  SVar4.super_SVIntStorage._14_2_ = (short)((ulong)uVar2 >> 0x30);
  SVar4.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar4.super_SVIntStorage;
}

Assistant:

SVInt SVInt::fromDouble(bitwidth_t bits, double value, bool isSigned, bool round) {
    return fromIEEE754<double, 11, 52, 1023>(bits, value, isSigned, round);
}